

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_true>_>_>
::_reduce_by_G(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_true>_>_>
               *this,Tmp_column *column,
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *chainsInH,Index currentIndex)

{
  Characteristic CVar1;
  undefined8 this_00;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *this_01;
  Characteristic *pCVar2;
  pointer ppVar3;
  Index local_4c;
  undefined1 local_48 [16];
  Field_operators *operators;
  Column *pCStack_30;
  Field_element coef;
  Column *col;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *pvStack_20;
  Index currentIndex_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *chainsInH_local;
  Tmp_column *column_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_true>_>_>
  *this_local;
  
  col._4_4_ = currentIndex;
  pvStack_20 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)chainsInH;
  chainsInH_local =
       (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        *)column;
  column_local = (Tmp_column *)this;
  pCStack_30 = get_column(this,currentIndex);
  operators._4_4_ =
       Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_true>_>_>
       ::get_pivot_value(pCStack_30);
  local_48._8_8_ = this->colSettings_;
  operators._4_4_ =
       persistence_fields::Zp_field_operators<unsigned_int,_void>::get_inverse
                 ((Zp_field_operators<unsigned_int,_void> *)local_48._8_8_,operators._4_4_);
  this_00 = local_48._8_8_;
  pCVar2 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_characteristic
                     ((Zp_field_operators<unsigned_int,_void> *)local_48._8_8_);
  CVar1 = *pCVar2;
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::rbegin((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            *)local_48);
  ppVar3 = std::
           reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>_>::
           operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_48);
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            ((Zp_field_operators<unsigned_int,_void> *)this_00,(Element *)((long)&operators + 4),
             CVar1 - ppVar3->second);
  _add_to(this,pCStack_30,(Tmp_column *)chainsInH_local,operators._4_4_);
  this_01 = pvStack_20;
  local_4c = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_true>_>_>
             ::get_paired_chain_index(&pCStack_30->super_Chain_column_option);
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int,unsigned_int&>(this_01,&local_4c,(uint *)((long)&operators + 4));
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_G(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInH,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);                           // Reduce with the column col_g
    chainsInH.push_back(col.get_paired_chain_index());  // keep the col_h with which col_g is paired
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);                                       // Reduce with the column col_g
    chainsInH.emplace_back(col.get_paired_chain_index(), coef); // keep the col_h with which col_g is paired
  }
}